

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

void sat_solver_reducedb(sat_solver *s)

{
  ABC_INT64_T *pAVar1;
  uint *puVar2;
  uint nSize;
  int iVar3;
  uint uVar4;
  int *piVar5;
  int **ppiVar6;
  int *piVar7;
  veci *pvVar8;
  int iVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint *puVar20;
  double dVar21;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar9 = clock_gettime(3,&local_48);
  if (iVar9 < 0) {
    local_38 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_38 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (s->nLearntMax < 1) {
    __assert_fail("s->nLearntMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x5fc,"void sat_solver_reducedb(sat_solver *)");
  }
  nSize = (s->act_clas).size;
  if (nSize != (s->Mem).nEntries[1]) {
    __assert_fail("nLearnedOld == Sat_MemEntryNum(pMem, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x5fd,"void sat_solver_reducedb(sat_solver *)");
  }
  if (nSize != (s->stats).learnts) {
    __assert_fail("nLearnedOld == (int)s->stats.learnts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x5fe,"void sat_solver_reducedb(sat_solver *)");
  }
  piVar5 = (s->act_clas).ptr;
  iVar9 = s->nDBreduces + 1;
  s->nDBreduces = iVar9;
  iVar12 = iVar9 * s->nLearntDelta + s->nLearntStart;
  s->nLearntMax = iVar12;
  piVar10 = (int *)malloc((long)(int)nSize * 4);
  iVar9 = (s->Mem).iPage[1];
  if (0 < iVar9) {
    ppiVar6 = (s->Mem).pPages;
    lVar14 = 1;
    do {
      piVar11 = ppiVar6[lVar14];
      if ((2 < *piVar11) && (piVar7 = (s->Mem).pPages[lVar14], piVar7 != (int *)0x0)) {
        iVar3 = s->ClaActType;
        uVar18 = 2;
        do {
          puVar20 = (uint *)(piVar7 + uVar18);
          uVar16 = *puVar20 >> 3 & 0xff;
          if (6 < uVar16) {
            uVar16 = 7;
          }
          uVar16 = (uVar16 ^ 7) << 0x1c;
          if (iVar3 == 0) {
            uVar16 = uVar16 | piVar5[(int)puVar20[(ulong)(*puVar20 >> 0xb) + 1]] >> 4;
          }
          piVar10[(int)puVar20[(ulong)(*puVar20 >> 0xb) + 1]] = uVar16;
          if ((int)uVar16 < 0) {
            __assert_fail("pSortValues[Id] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                          ,0x610,"void sat_solver_reducedb(sat_solver *)");
          }
          uVar18 = uVar18 + ((*puVar20 & 1) + (*puVar20 >> 0xb) + 2 & 0xfffffffe);
        } while ((int)uVar18 < *piVar11);
      }
      lVar14 = lVar14 + 2;
    } while ((int)lVar14 <= iVar9);
  }
  iVar9 = s->nLearntRatio;
  piVar11 = Abc_MergeSortCost(piVar10,nSize);
  if (piVar10[piVar11[(long)(int)nSize + -1]] < piVar10[*piVar11]) {
    __assert_fail("pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x61b,"void sat_solver_reducedb(sat_solver *)");
  }
  iVar9 = (int)((ulong)((long)(int)(iVar9 * nSize) * -0x51eb851f) >> 0x20);
  iVar9 = piVar10[piVar11[(int)(((iVar9 >> 5) - (iVar9 >> 0x1f)) + nSize)]];
  free(piVar11);
  if ((s->Mem).iPage[1] < 1) {
    uVar18 = 0;
    uVar16 = 0;
  }
  else {
    iVar12 = (int)((ulong)((long)iVar12 * -0x66666667) >> 0x20);
    uVar16 = 0;
    lVar14 = 1;
    uVar18 = 0;
    do {
      if (2 < *(s->Mem).pPages[lVar14]) {
        uVar17 = 2;
        do {
          piVar11 = (s->Mem).pPages[lVar14];
          if (piVar11 == (int *)0x0) break;
          puVar20 = (uint *)(piVar11 + uVar17);
          uVar4 = *puVar20;
          if ((uVar4 & 2) != 0) {
            __assert_fail("c->mark == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                          ,0x624,"void sat_solver_reducedb(sat_solver *)");
          }
          if (((((int)(((iVar12 >> 3) - (iVar12 >> 0x1f)) + nSize) < (int)uVar16) ||
               (uVar4 < 0x1800)) || (iVar9 < piVar10[(int)puVar20[(ulong)(uVar4 >> 0xb) + 1]])) ||
             (s->reasons[(int)puVar20[1] >> 1] ==
              ((int)lVar14 << ((byte)(s->Mem).nPageSize & 0x1f) | uVar17))) {
            lVar19 = (long)(int)uVar18;
            uVar18 = uVar18 + 1;
            piVar5[lVar19] = piVar5[(int)puVar20[(ulong)(uVar4 >> 0xb) + 1]];
          }
          else {
            *puVar20 = uVar4 | 2;
            pAVar1 = &(s->stats).learnts_literals;
            *pAVar1 = *pAVar1 - (ulong)(uVar4 >> 0xb);
            puVar2 = &(s->stats).learnts;
            *puVar2 = *puVar2 - 1;
          }
          uVar17 = uVar17 + ((*puVar20 & 1) + (*puVar20 >> 0xb) + 2 & 0xfffffffe);
          uVar16 = uVar16 + 1;
        } while ((int)uVar17 < *(s->Mem).pPages[lVar14]);
      }
      lVar14 = lVar14 + 2;
    } while ((int)lVar14 <= (s->Mem).iPage[1]);
  }
  if ((s->stats).learnts != uVar18) {
    __assert_fail("s->stats.learnts == (unsigned)j",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x62e,"void sat_solver_reducedb(sat_solver *)");
  }
  if (uVar16 != nSize) {
    __assert_fail("Counter == nLearnedOld",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x62f,"void sat_solver_reducedb(sat_solver *)");
  }
  if ((s->act_clas).size < (int)uVar18) {
LAB_0054c253:
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->act_clas).size = uVar18;
  if (piVar10 != (int *)0x0) {
    free(piVar10);
  }
  uVar18 = Sat_MemCompactLearned(&s->Mem,0);
  if (uVar18 != (s->stats).learnts) {
    __assert_fail("Counter == (int)s->stats.learnts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x635,"void sat_solver_reducedb(sat_solver *)");
  }
  if (0 < s->size) {
    piVar5 = s->reasons;
    lVar14 = 0;
    do {
      uVar18 = piVar5[lVar14];
      if (((uVar18 & 1) == 0 && uVar18 != 0) && (((s->Mem).uLearnedMask & uVar18) != 0)) {
        uVar16 = (s->Mem).uPageMask & uVar18;
        if (uVar16 == 0) {
LAB_0054c234:
          __assert_fail("k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                        ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
        }
        piVar10 = (s->Mem).pPages[(int)uVar18 >> ((byte)(s->Mem).nPageSize & 0x1f)];
        uVar18 = piVar10[(int)uVar16];
        if ((uVar18 & 2) != 0) {
          __assert_fail("c->mark == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                        ,0x641,"void sat_solver_reducedb(sat_solver *)");
        }
        piVar5[lVar14] = piVar10[(long)(int)uVar16 + (ulong)(uVar18 >> 0xb) + 1];
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < s->size);
  }
  if (0 < s->size) {
    pvVar8 = s->wlists;
    lVar14 = 0;
    do {
      iVar9 = pvVar8[lVar14].size;
      iVar12 = 0;
      if (0 < iVar9) {
        piVar5 = pvVar8[lVar14].ptr;
        lVar19 = 0;
        iVar12 = 0;
        do {
          uVar18 = piVar5[lVar19];
          if (((uVar18 & 1) == 0) && (((s->Mem).uLearnedMask & uVar18) != 0)) {
            if (uVar18 == 0) {
              puVar20 = (uint *)0x0;
            }
            else {
              uVar16 = (s->Mem).uPageMask & uVar18;
              if (uVar16 == 0) goto LAB_0054c234;
              puVar20 = (uint *)((s->Mem).pPages[(int)uVar18 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                                (int)uVar16);
            }
            if ((*puVar20 & 2) == 0) {
              uVar18 = puVar20[(ulong)(*puVar20 >> 0xb) + 1];
              goto LAB_0054c0d4;
            }
          }
          else {
LAB_0054c0d4:
            lVar13 = (long)iVar12;
            iVar12 = iVar12 + 1;
            piVar5[lVar13] = uVar18;
          }
          lVar19 = lVar19 + 1;
          iVar9 = pvVar8[lVar14].size;
        } while (lVar19 < iVar9);
      }
      if (iVar9 < iVar12) goto LAB_0054c253;
      pvVar8[lVar14].size = iVar12;
      lVar14 = lVar14 + 1;
    } while (SBORROW8(lVar14,(long)s->size * 2) != lVar14 + (long)s->size * -2 < 0);
  }
  uVar18 = Sat_MemCompactLearned(&s->Mem,1);
  if (uVar18 != (s->stats).learnts) {
    __assert_fail("Counter == (int)s->stats.learnts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x65b,"void sat_solver_reducedb(sat_solver *)");
  }
  iVar12 = 3;
  iVar9 = clock_gettime(3,&local_48);
  if (iVar9 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  sat_solver_reducedb::TimeTotal = sat_solver_reducedb::TimeTotal + lVar14 + local_38;
  if (s->fVerbose != 0) {
    uVar15 = (ulong)(s->stats).learnts;
    Abc_Print(iVar12,"reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
              ((double)uVar15 * 100.0) / (double)(int)nSize,uVar15,(ulong)nSize);
    dVar21 = (double)sat_solver_reducedb::TimeTotal;
    Abc_Print(iVar12,"%s =","Time");
    Abc_Print(iVar12,"%9.2f sec\n",dVar21 / 1000000.0);
  }
  return;
}

Assistant:

void sat_solver_reducedb(sat_solver* s)
{
    static abctime TimeTotal = 0;
    abctime clk = Abc_Clock();
    Sat_Mem_t * pMem = &s->Mem;
    int nLearnedOld = veci_size(&s->act_clas);
    int * act_clas = veci_begin(&s->act_clas);
    int * pPerm, * pArray, * pSortValues, nCutoffValue;
    int i, k, j, Id, Counter, CounterStart, nSelected;
    clause * c;

    assert( s->nLearntMax > 0 );
    assert( nLearnedOld == Sat_MemEntryNum(pMem, 1) );
    assert( nLearnedOld == (int)s->stats.learnts );

    s->nDBreduces++;

    //printf( "Calling reduceDB with %d learned clause limit.\n", s->nLearntMax );
    s->nLearntMax = s->nLearntStart + s->nLearntDelta * s->nDBreduces;
//    return;

    // create sorting values
    pSortValues = ABC_ALLOC( int, nLearnedOld );
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        Id = clause_id(c);
//        pSortValues[Id] = act[Id];
        if ( s->ClaActType == 0 )
            pSortValues[Id] = ((7 - Abc_MinInt(c->lbd, 7)) << 28) | (act_clas[Id] >> 4);
        else
            pSortValues[Id] = ((7 - Abc_MinInt(c->lbd, 7)) << 28);// | (act_clas[Id] >> 4);
        assert( pSortValues[Id] >= 0 );
    }

    // preserve 1/20 of last clauses
    CounterStart  = nLearnedOld - (s->nLearntMax / 20);

    // preserve 3/4 of most active clauses
    nSelected = nLearnedOld*s->nLearntRatio/100;

    // find non-decreasing permutation
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld-nSelected]];
    ABC_FREE( pPerm );
//    ActCutOff = ABC_INFINITY;

    // mark learned clauses to remove
    Counter = j = 0;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 3 || pSortValues[clause_id(c)] > nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
            act_clas[j++] = act_clas[clause_id(c)];
        else // delete
        {
            c->mark = 1;
            s->stats.learnts_literals -= clause_size(c);
            s->stats.learnts--;
        }
    }
    assert( s->stats.learnts == (unsigned)j );
    assert( Counter == nLearnedOld );
    veci_resize(&s->act_clas,j);
    ABC_FREE( pSortValues );

    // update ID of each clause to be its new handle
    Counter = Sat_MemCompactLearned( pMem, 0 );
    assert( Counter == (int)s->stats.learnts );

    // update reasons
    for ( i = 0; i < s->size; i++ )
    {
        if ( !s->reasons[i] ) // no reason
            continue;
        if ( clause_is_lit(s->reasons[i]) ) // 2-lit clause
            continue;
        if ( !clause_learnt_h(pMem, s->reasons[i]) ) // problem clause
            continue;
        c = clause_read( s, s->reasons[i] );
        assert( c->mark == 0 );
        s->reasons[i] = clause_id(c); // updating handle here!!!
    }

    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            if ( clause_is_lit(pArray[k]) ) // 2-lit clause
                pArray[j++] = pArray[k];
            else if ( !clause_learnt_h(pMem, pArray[k]) ) // problem clause
                pArray[j++] = pArray[k];
            else 
            {
                c = clause_read(s, pArray[k]);
                if ( !c->mark ) // useful learned clause
                   pArray[j++] = clause_id(c); // updating handle here!!!
            }
        }
        veci_resize(&s->wlists[i],j);
    }

    // perform final move of the clauses
    Counter = Sat_MemCompactLearned( pMem, 1 );
    assert( Counter == (int)s->stats.learnts );

    // report the results
    TimeTotal += Abc_Clock() - clk;
    if ( s->fVerbose )
    {
    Abc_Print(1, "reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
        s->stats.learnts, nLearnedOld, 100.0 * s->stats.learnts / nLearnedOld );
    Abc_PrintTime( 1, "Time", TimeTotal );
    }
}